

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O1

void * __thiscall
pstd::pmr::monotonic_buffer_resource::do_allocate
          (monotonic_buffer_resource *this,size_t bytes,size_t align)

{
  size_t *psVar1;
  MemoryBlock *pMVar2;
  list<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
  *plVar3;
  size_t sVar4;
  int iVar5;
  undefined4 extraout_var;
  _List_node_base *p_Var6;
  _List_node_base *p_Var7;
  undefined4 extraout_var_00;
  ulong uVar8;
  
  if (this->blockSize < bytes) {
    iVar5 = (*this->upstreamResource->_vptr_memory_resource[2])(this->upstreamResource,bytes,align);
    p_Var6 = (_List_node_base *)operator_new(0x20);
    p_Var6[1]._M_next = (_List_node_base *)CONCAT44(extraout_var,iVar5);
    p_Var6[1]._M_prev = (_List_node_base *)bytes;
    std::__detail::_List_node_base::_M_hook(p_Var6);
    psVar1 = &(this->usedBlocks).
              super__List_base<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
    p_Var6 = (this->usedBlocks).
             super__List_base<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
             ._M_impl._M_node.super__List_node_base._M_prev[1]._M_next;
  }
  else {
    uVar8 = this->currentBlockPos % align;
    if (uVar8 != 0) {
      this->currentBlockPos = (this->currentBlockPos + align) - uVar8;
    }
    uVar8 = (this->currentBlock).size;
    if (uVar8 < this->currentBlockPos + bytes) {
      pMVar2 = &this->currentBlock;
      if (uVar8 != 0) {
        p_Var7 = (_List_node_base *)operator_new(0x20);
        p_Var6 = (_List_node_base *)(this->currentBlock).size;
        p_Var7[1]._M_next = (_List_node_base *)pMVar2->ptr;
        p_Var7[1]._M_prev = p_Var6;
        std::__detail::_List_node_base::_M_hook(p_Var7);
        psVar1 = &(this->usedBlocks).
                  super__List_base<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
                  ._M_impl._M_node._M_size;
        *psVar1 = *psVar1 + 1;
        pMVar2->ptr = (void *)0x0;
        (this->currentBlock).size = 0;
      }
      plVar3 = &this->availableBlocks;
      p_Var6 = (_List_node_base *)plVar3;
      do {
        p_Var6 = (((_List_base<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
                    *)&p_Var6->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
        if (p_Var6 == (_List_node_base *)plVar3) goto LAB_0021666c;
      } while (p_Var6[1]._M_prev < bytes);
      p_Var7 = p_Var6[1]._M_prev;
      pMVar2->ptr = p_Var6[1]._M_next;
      (this->currentBlock).size = (size_t)p_Var7;
      psVar1 = &(this->availableBlocks).
                super__List_base<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
                ._M_impl._M_node._M_size;
      *psVar1 = *psVar1 - 1;
      std::__detail::_List_node_base::_M_unhook();
      operator_delete(p_Var6,0x20);
      if (p_Var6 == (_List_node_base *)plVar3) {
LAB_0021666c:
        iVar5 = (*this->upstreamResource->_vptr_memory_resource[2])
                          (this->upstreamResource,this->blockSize,0x10);
        sVar4 = this->blockSize;
        (this->currentBlock).ptr = (void *)CONCAT44(extraout_var_00,iVar5);
        (this->currentBlock).size = sVar4;
      }
      this->currentBlockPos = 0;
    }
    p_Var6 = (_List_node_base *)((long)(this->currentBlock).ptr + this->currentBlockPos);
    this->currentBlockPos = bytes + this->currentBlockPos;
  }
  return p_Var6;
}

Assistant:

void *do_allocate(size_t bytes, size_t align) override {
        if (bytes > blockSize) {
            // We've got a big allocation; let the current block be so that
            // smaller allocations have a chance at using up more of it.
            usedBlocks.push_back(
                MemoryBlock{upstreamResource->allocate(bytes, align), bytes});
            return usedBlocks.back().ptr;
        }

        if ((currentBlockPos % align) != 0)
            currentBlockPos += align - (currentBlockPos % align);
        DCHECK_EQ(0, currentBlockPos % align);

        if (currentBlockPos + bytes > currentBlock.size) {
            // Add current block to _usedBlocks_ list
            if (currentBlock.size) {
                usedBlocks.push_back(currentBlock);
                currentBlock = {};
            }

            // Get new block of memory for _MemoryArena_

            // Try to get memory block from _availableBlocks_
            for (auto iter = availableBlocks.begin(); iter != availableBlocks.end();
                 ++iter) {
                if (bytes <= iter->size) {
                    currentBlock = std::move(*iter);
                    availableBlocks.erase(iter);
                    goto success;
                }
            }
            currentBlock = {
                upstreamResource->allocate(blockSize, alignof(std::max_align_t)),
                blockSize};
        success:
            currentBlockPos = 0;
        }

        void *ptr = (char *)currentBlock.ptr + currentBlockPos;
        currentBlockPos += bytes;
        return ptr;
    }